

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall duckdb::HashJoinFinalizeEvent::Schedule(HashJoinFinalizeEvent *this)

{
  HashJoinGlobalSinkState *pHVar1;
  PhysicalHashJoin *pPVar2;
  bool bVar3;
  Pipeline *this_00;
  type pJVar4;
  type this_01;
  idx_t chunk_idx_to_p;
  HashJoinFinalizeTask *pHVar5;
  ulong uVar6;
  long lVar7;
  idx_t chunk_idx_from_p;
  enable_shared_from_this<duckdb::Task> *peVar8;
  idx_t chunk_idx_to_p_00;
  _Head_base<0UL,_duckdb::HashJoinFinalizeTask_*,_false> local_d0;
  enable_shared_from_this<duckdb::Event> local_c8;
  ClientContext *local_b0;
  shared_ptr<duckdb::Task,_true> local_a8;
  shared_ptr<duckdb::Event,_true> local_98;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> finalize_tasks;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_b0 = Pipeline::GetClientContext(this_00);
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pJVar4 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator*(&this->sink->hash_table);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&pJVar4->data_collection);
  chunk_idx_to_p = TupleDataCollection::ChunkCount(this_01);
  bVar3 = FinalizeSingleThreaded(this->sink,true);
  if (bVar3) {
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_c8);
    pHVar1 = this->sink;
    pPVar2 = pHVar1->op;
    pHVar5 = (HashJoinFinalizeTask *)operator_new(0x70);
    local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_c8.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    HashJoinFinalizeTask::HashJoinFinalizeTask
              (pHVar5,&local_98,local_b0,pHVar1,0,chunk_idx_to_p,false,(PhysicalOperator *)pPVar2);
    local_d0._M_head_impl = pHVar5;
    if (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::HashJoinFinalizeTask,std::default_delete<duckdb::HashJoinFinalizeTask>,void>
              ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               (unique_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>_>
                *)&local_d0);
    peVar8 = &(local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->super_enable_shared_from_this<duckdb::Task>;
    if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (Task *)0x0) {
      peVar8 = (enable_shared_from_this<duckdb::Task> *)0x0;
    }
    shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
              (&local_a8,peVar8,
               local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&finalize_tasks,&local_a8);
    if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_d0._M_head_impl != (HashJoinFinalizeTask *)0x0) {
      (*((local_d0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
    }
    local_d0._M_head_impl = (HashJoinFinalizeTask *)0x0;
    if (local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.__weak_this_.internal.
                 super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  else {
    lVar7 = 0x40;
    if ((local_b0->config).verify_parallelism != false) {
      lVar7 = 1;
    }
    if (chunk_idx_to_p != 0) {
      chunk_idx_from_p = 0;
      do {
        uVar6 = lVar7 + chunk_idx_from_p;
        chunk_idx_to_p_00 = chunk_idx_to_p;
        if (uVar6 < chunk_idx_to_p) {
          chunk_idx_to_p_00 = uVar6;
        }
        enable_shared_from_this<duckdb::Event>::shared_from_this(&local_c8);
        pHVar1 = this->sink;
        pPVar2 = pHVar1->op;
        pHVar5 = (HashJoinFinalizeTask *)operator_new(0x70);
        local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_c8.__weak_this_.internal.
             super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_c8.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_c8.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        HashJoinFinalizeTask::HashJoinFinalizeTask
                  (pHVar5,&local_98,local_b0,pHVar1,chunk_idx_from_p,chunk_idx_to_p_00,true,
                   (PhysicalOperator *)pPVar2);
        local_d0._M_head_impl = pHVar5;
        if (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<duckdb::HashJoinFinalizeTask,std::default_delete<duckdb::HashJoinFinalizeTask>,void>
                  ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                   (unique_ptr<duckdb::HashJoinFinalizeTask,_std::default_delete<duckdb::HashJoinFinalizeTask>_>
                    *)&local_d0);
        peVar8 = &(local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_enable_shared_from_this<duckdb::Task>;
        if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (Task *)0x0) {
          peVar8 = (enable_shared_from_this<duckdb::Task> *)0x0;
        }
        shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                  (&local_a8,peVar8,
                   local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        ::std::
        vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
        ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                  ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                    *)&finalize_tasks,&local_a8);
        if (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_d0._M_head_impl != (HashJoinFinalizeTask *)0x0) {
          (*((local_d0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
        }
        local_d0._M_head_impl = (HashJoinFinalizeTask *)0x0;
        if (local_c8.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.__weak_this_.internal.
                     super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        chunk_idx_from_p = uVar6;
      } while (uVar6 < chunk_idx_to_p);
    }
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       finalize_tasks.
       super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finalize_tasks.
  super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&finalize_tasks.
             super_vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
           );
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();

		vector<shared_ptr<Task>> finalize_tasks;
		auto &ht = *sink.hash_table;
		const auto chunk_count = ht.GetDataCollection().ChunkCount();

		// if the keys are too skewed, we finalize single-threaded
		if (FinalizeSingleThreaded(sink, true)) {
			// Single-threaded finalize
			finalize_tasks.push_back(
			    make_uniq<HashJoinFinalizeTask>(shared_from_this(), context, sink, 0U, chunk_count, false, sink.op));
		} else {
			// Parallel finalize
			const idx_t chunks_per_task = context.config.verify_parallelism ? 1 : CHUNKS_PER_TASK;
			for (idx_t chunk_idx = 0; chunk_idx < chunk_count; chunk_idx += chunks_per_task) {
				auto chunk_idx_to = MinValue<idx_t>(chunk_idx + chunks_per_task, chunk_count);
				finalize_tasks.push_back(make_uniq<HashJoinFinalizeTask>(shared_from_this(), context, sink, chunk_idx,
				                                                         chunk_idx_to, true, sink.op));
			}
		}
		SetTasks(std::move(finalize_tasks));
	}